

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcess.cpp
# Opt level: O0

void ac::core::detail::rgb2yuv<unsigned_short,unsigned_short>(Image *src,Image *dsty,Image *dstuv)

{
  Image *in_stack_00000058;
  Image *in_stack_00000060;
  Image *in_stack_00000068;
  anon_class_1_0_00000001 *in_stack_00000070;
  
  filter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TianZerL[P]Anime4KCPP_core_src_ImageProcess_cpp:92:16),_const_ac::core::Image,_ac::core::Image,_ac::core::Image,_true>
            (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

inline void rgb2yuv(const Image& src, Image& dsty, Image& dstuv)
    {
        filter([](const int /*i*/, const int /*j*/, const void* const sptr, void* const yptr, void* const uvptr) {
            auto in = static_cast<const IN*>(sptr);
            auto yout = static_cast<OUT*>(yptr);
            auto uvout = static_cast<OUT*>(uvptr);

            float r = toFloat(in[0]);
            float g = toFloat(in[1]);
            float b = toFloat(in[2]);

            float y = 0.299f * r + 0.587f * g + 0.114f * b;
            float u = 0.564f * (b - y) + 0.5f;
            float v = 0.713f * (r - y) + 0.5f;

            yout[0] = fromFloat<OUT>(y);
            uvout[0] = fromFloat<OUT>(u);
            uvout[1] = fromFloat<OUT>(v);
        }, src, dsty, dstuv);
    }